

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O0

void aes_cbc_sw_encrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  uint8_t *finish;
  uint8_t *blk;
  aes_sw_context *ctx;
  int blklen_local;
  void *vblk_local;
  ssh_cipher *ciph_local;
  
  for (finish = (uint8_t *)vblk; finish < (uint8_t *)((long)vblk + (long)blklen);
      finish = finish + 0x10) {
    memxor16(ciph + -0xb,ciph + -0xb,finish);
    aes_sliced_e_serial((uint8_t *)(ciph + -0xb),(uint8_t *)(ciph + -0xb),
                        (aes_sliced_key *)(ciph + -0xa2));
    *(ssh_cipheralg **)finish = ciph[-0xb].vt;
    *(ssh_cipheralg **)(finish + 8) = ciph[-10].vt;
  }
  return;
}

Assistant:

static inline void aes_cbc_sw_encrypt(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);

    /*
     * CBC encryption has to be done serially, because the input to
     * each run of the cipher includes the output from the previous
     * run.
     */

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        /*
         * We use the IV array itself as the location for the
         * encryption, because there's no reason not to.
         */

        /* XOR the new plaintext block into the previous cipher block */
        memxor16(ctx->iv.cbc.prevblk, ctx->iv.cbc.prevblk, blk);

        /* Run the cipher over the result, which leaves it
         * conveniently already stored in ctx->iv */
        aes_sliced_e_serial(
            ctx->iv.cbc.prevblk, ctx->iv.cbc.prevblk, &ctx->sk);

        /* Copy it to the output location */
        memcpy(blk, ctx->iv.cbc.prevblk, 16);
    }
}